

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkEvolve(ARKodeMem ark_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  int iVar1;
  int in_ECX;
  realtype *in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  int *nflagPtr;
  double dVar2;
  int constrfails;
  int nef;
  int ncf;
  int attempts;
  int nflag;
  realtype dsm;
  int inactive_roots;
  realtype nrm;
  realtype troundoff;
  int ewtsetOK;
  int ir;
  int istate;
  int kflag;
  int retval;
  long nstloc;
  N_Vector in_stack_ffffffffffffff58;
  N_Vector in_stack_ffffffffffffff60;
  ARKodeMem in_stack_ffffffffffffff68;
  realtype *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int k;
  realtype in_stack_ffffffffffffff90;
  realtype rVar6;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ARKodeMem in_stack_ffffffffffffffa8;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkEvolve","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,"ARKode","arkEvolve","Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else {
    in_RDI->ycur = in_RSI;
    if (in_RSI == (N_Vector)0x0) {
      arkProcessError(in_RDI,-0x16,"ARKode","arkEvolve","yout = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RDX == (realtype *)0x0) {
      arkProcessError(in_RDI,-0x16,"ARKode","arkEvolve","tret = NULL illegal.");
      local_4 = -0x16;
    }
    else if ((in_ECX == 1) || (in_ECX == 2)) {
      if (in_RDI->root_mem != (ARKodeRootMem)0x0) {
        if (in_ECX == 1) {
          in_RDI->root_mem->toutc = in_XMM0_Qa;
        }
        in_RDI->root_mem->taskc = in_ECX;
      }
      if (in_RDI->initsetup != 0) {
        rVar6 = in_RDI->tcur;
        *in_RDX = rVar6;
        in_RDI->tretlast = rVar6;
        local_3c = arkInitialSetup((ARKodeMem)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                   in_stack_ffffffffffffff90);
        if (local_3c != 0) {
          return local_3c;
        }
      }
      if ((in_RDI->initsetup == 0) &&
         (iVar1 = arkStopTests((ARKodeMem)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                               (realtype)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               (N_Vector)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff70,
                               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                               (int *)in_stack_ffffffffffffff60), iVar1 != 0)) {
        local_4 = local_3c;
      }
      else {
        local_38 = 0;
        do {
          in_RDI->next_h = in_RDI->h;
          if (in_RDI->initsetup == 0) {
            iVar1 = (*in_RDI->efun)(in_RDI->yn,in_RDI->ewt,in_RDI->e_data);
            if (iVar1 != 0) {
              if (in_RDI->itol == 2) {
                arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,"ARKode",
                                "arkEvolve","At t = %lg, the user-provide EwtSet function failed.");
              }
              else {
                arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,"ARKode",
                                "arkEvolve","At t = %lg, a component of ewt has become <= 0.");
              }
              local_44 = -0x16;
              rVar6 = in_RDI->tcur;
              *in_RDX = rVar6;
              in_RDI->tretlast = rVar6;
              N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (N_Vector)0xec0289);
              goto LAB_00ec11e3;
            }
            if ((in_RDI->rwt_is_ewt == 0) &&
               (iVar1 = (*in_RDI->rfun)(in_RDI->yn,in_RDI->rwt,in_RDI->r_data), iVar1 != 0)) {
              if (in_RDI->itol == 2) {
                arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,"ARKode",
                                "arkEvolve","At t = %lg, the user-provide RwtSet function failed.");
              }
              else {
                arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xffffffea,"ARKode",
                                "arkEvolve","At t = %lg, a component of rwt has become <= 0.");
              }
              local_44 = -0x16;
              rVar6 = in_RDI->tcur;
              *in_RDX = rVar6;
              in_RDI->tretlast = rVar6;
              N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (N_Vector)0xec03c4);
              goto LAB_00ec11e3;
            }
          }
          if ((0 < in_RDI->mxstep) && (in_RDI->mxstep <= local_38)) {
            arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xffffffff,"ARKode",
                            "arkEvolve","At t = %lg, mxstep steps taken before reaching tout.");
            local_44 = -1;
            rVar6 = in_RDI->tcur;
            *in_RDX = rVar6;
            in_RDI->tretlast = rVar6;
            N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (N_Vector)0xec048e);
            goto LAB_00ec11e3;
          }
          nflagPtr = (int *)N_VWrmsNorm(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          in_RDI->tolsf = in_RDI->uround * (double)nflagPtr;
          if (1.0 < in_RDI->tolsf) {
            arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0xfffffffe,"ARKode",
                            "arkEvolve","At t = %lg, too much accuracy requested.");
            local_44 = -2;
            rVar6 = in_RDI->tcur;
            *in_RDX = rVar6;
            in_RDI->tretlast = rVar6;
            N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (N_Vector)0xec0592);
            in_RDI->tolsf = in_RDI->tolsf * 2.0;
            goto LAB_00ec11e3;
          }
          in_RDI->tolsf = 1.0;
          dVar2 = in_RDI->tcur + in_RDI->h;
          if ((dVar2 == in_RDI->tcur) && (!NAN(dVar2) && !NAN(in_RDI->tcur))) {
            in_RDI->nhnil = in_RDI->nhnil + 1;
            if (in_RDI->nhnil <= in_RDI->mxhnil) {
              arkProcessError((ARKodeMem)in_RDI->tcur,(int)in_RDI,(char *)0x63,"ARKode","arkEvolve",
                              "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                             );
            }
            if (in_RDI->nhnil == in_RDI->mxhnil) {
              arkProcessError(in_RDI,99,"ARKode","arkEvolve",
                              "The above warning has been issued mxhnil times and will not be issued again for this problem."
                             );
            }
          }
          if ((in_RDI->hprime != in_RDI->h) || (NAN(in_RDI->hprime) || NAN(in_RDI->h))) {
            in_RDI->h = in_RDI->h * in_RDI->eta;
            in_RDI->next_h = in_RDI->h;
          }
          if (in_RDI->fixedstep != 0) {
            in_RDI->h = in_RDI->hin;
            in_RDI->next_h = in_RDI->h;
            if ((in_RDI->tstopset != 0) &&
               (0.0 < ((in_RDI->tcur + in_RDI->h) - in_RDI->tstop) * in_RDI->h)) {
              in_RDI->h = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
            }
          }
          rVar6 = 0.0;
          in_RDI->last_kflag = 0;
          uVar3 = 0;
          uVar4 = 0;
          uVar5 = 0;
          iVar1 = 0;
          k = 6;
          while( true ) {
            iVar1 = iVar1 + 1;
            in_RDI->nst_attempts = in_RDI->nst_attempts + 1;
            local_40 = (*in_RDI->step)(in_RDI,(realtype *)&stack0xffffffffffffff90,
                                       (int *)&stack0xffffffffffffff8c);
            if (((local_40 < 0) ||
                (local_40 = arkCheckConvergence(in_stack_ffffffffffffff68,
                                                (int *)in_stack_ffffffffffffff60,
                                                (int *)in_stack_ffffffffffffff58), local_40 < 0)) ||
               ((in_RDI->constraintsSet != 0 &&
                ((local_40 == 0 &&
                 (local_40 = arkCheckConstraints((ARKodeMem)CONCAT44(k,iVar1),
                                                 (int *)CONCAT44(uVar5,uVar4),
                                                 (int *)CONCAT44(uVar3,in_stack_ffffffffffffff78)),
                 local_40 < 0)))))) goto LAB_00ec0c75;
            if (in_RDI->fixedstep != 0) break;
            if ((local_40 == 0) &&
               (local_40 = arkCheckTemporalError
                                     (in_stack_ffffffffffffffa8,nflagPtr,
                                      (int *)CONCAT44(in_stack_ffffffffffffff9c,
                                                      in_stack_ffffffffffffff98),rVar6),
               local_40 < 0)) goto LAB_00ec0c75;
            if (in_RDI->hadapt_mem->etamax <= in_RDI->eta) {
              in_stack_ffffffffffffff70 = (realtype *)in_RDI->hadapt_mem->etamax;
            }
            else {
              in_stack_ffffffffffffff70 = (realtype *)in_RDI->eta;
            }
            in_RDI->eta = (realtype)in_stack_ffffffffffffff70;
            if (in_RDI->eta <= in_RDI->hmin / ABS(in_RDI->h)) {
              in_stack_ffffffffffffff68 = (ARKodeMem)(in_RDI->hmin / ABS(in_RDI->h));
            }
            else {
              in_stack_ffffffffffffff68 = (ARKodeMem)in_RDI->eta;
            }
            in_RDI->eta = (realtype)in_stack_ffffffffffffff68;
            if (1.0 <= ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta) {
              in_stack_ffffffffffffff60 =
                   (N_Vector)(ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta);
            }
            else {
              in_stack_ffffffffffffff60 = (N_Vector)&DAT_3ff0000000000000;
            }
            in_RDI->eta = in_RDI->eta / (double)in_stack_ffffffffffffff60;
            if (in_RDI->force_pass != 0) {
              in_RDI->last_kflag = local_40;
              local_40 = 0;
              goto LAB_00ec0c75;
            }
            if (local_40 == 0) goto LAB_00ec0c75;
            if (ABS(in_RDI->h) <= in_RDI->hmin * 1.000001) {
              return -3;
            }
            in_RDI->h = in_RDI->eta * in_RDI->h;
            in_RDI->hprime = in_RDI->h;
            in_RDI->next_h = in_RDI->h;
          }
          in_RDI->eta = 1.0;
LAB_00ec0c75:
          if (local_40 == 0) {
            local_40 = arkCompleteStep(in_stack_ffffffffffffff68,(realtype)in_stack_ffffffffffffff60
                                      );
          }
          if (local_40 != 0) {
            local_44 = arkHandleFailure((ARKodeMem)CONCAT44(uVar3,in_stack_ffffffffffffff78),
                                        (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
            rVar6 = in_RDI->tcur;
            *in_RDX = rVar6;
            in_RDI->tretlast = rVar6;
            N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     (N_Vector)0xec0cff);
            goto LAB_00ec11e3;
          }
          local_38 = local_38 + 1;
          if ((in_RDI->root_mem != (ARKodeRootMem)0x0) && (0 < in_RDI->root_mem->nrtfn)) {
            iVar1 = arkRootCheck3((void *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
            if (iVar1 == 1) {
              in_RDI->root_mem->irfnd = 1;
              local_44 = 2;
              rVar6 = in_RDI->root_mem->tlo;
              *in_RDX = rVar6;
              in_RDI->tretlast = rVar6;
              goto LAB_00ec11e3;
            }
            if (iVar1 == -0xc) {
              arkProcessError((ARKodeMem)in_RDI->root_mem->tlo,(int)in_RDI,(char *)0xfffffff4,
                              "ARKode","arkEvolve",
                              "At t = %lg, the rootfinding routine failed in an unrecoverable manner."
                             );
              local_44 = -0xc;
              goto LAB_00ec11e3;
            }
            if (in_RDI->nst == 1) {
              in_stack_ffffffffffffff9c = 0;
              for (local_48 = 0; local_48 < in_RDI->root_mem->nrtfn; local_48 = local_48 + 1) {
                if (in_RDI->root_mem->gactive[local_48] == 0) {
                  in_stack_ffffffffffffff9c = 1;
                  break;
                }
              }
              if ((0 < in_RDI->root_mem->mxgnull) && (in_stack_ffffffffffffff9c != 0)) {
                arkProcessError(in_RDI,99,"ARKode","arkEvolve",
                                "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                               );
              }
            }
          }
          if ((in_ECX == 1) && (0.0 <= (in_RDI->tcur - in_XMM0_Qa) * in_RDI->h)) {
            local_44 = 0;
            *in_RDX = in_XMM0_Qa;
            in_RDI->tretlast = in_XMM0_Qa;
            arkGetDky((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),rVar6
                      ,k,(N_Vector)CONCAT44(uVar5,uVar4));
            in_RDI->next_h = in_RDI->hprime;
            goto LAB_00ec11e3;
          }
          if (in_RDI->tstopset != 0) {
            in_stack_ffffffffffffffa8 =
                 (ARKodeMem)(in_RDI->uround * 100.0 * (ABS(in_RDI->tcur) + ABS(in_RDI->h)));
            if (ABS(in_RDI->tcur - in_RDI->tstop) <= (double)in_stack_ffffffffffffffa8) {
              arkGetDky((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        rVar6,k,(N_Vector)CONCAT44(uVar5,uVar4));
              rVar6 = in_RDI->tstop;
              *in_RDX = rVar6;
              in_RDI->tretlast = rVar6;
              in_RDI->tstopset = 0;
              local_44 = 1;
              goto LAB_00ec11e3;
            }
            if (0.0 < ((in_RDI->tcur + in_RDI->hprime) - in_RDI->tstop) * in_RDI->h) {
              in_RDI->hprime = (in_RDI->tstop - in_RDI->tcur) * (in_RDI->uround * -4.0 + 1.0);
              in_RDI->eta = in_RDI->hprime / in_RDI->h;
            }
          }
        } while (in_ECX != 2);
        local_44 = 0;
        rVar6 = in_RDI->tcur;
        *in_RDX = rVar6;
        in_RDI->tretlast = rVar6;
        N_VScale((realtype)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(N_Vector)0xec11bc);
        in_RDI->next_h = in_RDI->hprime;
LAB_00ec11e3:
        local_4 = local_44;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode","arkEvolve","Illegal value for itask.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int arkEvolve(ARKodeMem ark_mem, realtype tout, N_Vector yout,
              realtype *tret, int itask)
{
  long int nstloc;
  int retval, kflag, istate, ir;
  int ewtsetOK;
  realtype troundoff, nrm;
  booleantype inactive_roots;
  realtype dsm;
  int nflag, attempts, ncf, nef, constrfails;

  /* Check and process inputs */

  /* Check if ark_mem exists */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode", "arkEvolve",
                    MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode", "arkEvolve",
                    MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((ark_mem->ycur = yout) == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_YOUT_NULL);
    return(ARK_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_TRET_NULL);
    return(ARK_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != ARK_NORMAL) && (itask != ARK_ONE_STEP) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                    MSG_ARK_BAD_ITASK);
    return(ARK_ILL_INPUT);
  }

  /* store copy of itask if using root-finding */
  if (ark_mem->root_mem != NULL) {
    if (itask == ARK_NORMAL) ark_mem->root_mem->toutc = tout;
    ark_mem->root_mem->taskc = itask;
  }


  /* perform first-step-specific initializations:
     - initialize tret values to initialization time
     - perform initial integrator setup  */
  if (ark_mem->initsetup) {
    ark_mem->tretlast = *tret = ark_mem->tcur;
    retval = arkInitialSetup(ark_mem, tout);
    if (retval!= ARK_SUCCESS) return(retval);
  }

  /* perform stopping tests */
  if (!ark_mem->initsetup)
    if (arkStopTests(ark_mem, tout, yout, tret, itask, &retval))
      return(retval);


  /*--------------------------------------------------
    Looping point for successful internal steps

    - update the ewt/rwt vectors for upcoming step
    - check for errors (too many steps, too much
      accuracy requested, step size too small)
    - loop over attempts at a new step:
      * try to take step (via time stepper module),
        handle solver convergence or other failures
      * perform constraint-handling (if selected)
      * check temporal error
      * if all of the above pass, complete step by
        updating current time, solution, error &
        stepsize history arrays.
    - perform stop tests:
      * check for root in last step taken
      * check if tout was passed
      * check if close to tstop
      * check if in ONE_STEP mode (must return)
    --------------------------------------------------*/
  nstloc = 0;
  for(;;) {

    ark_mem->next_h = ark_mem->h;

    /* Reset and check ewt and rwt */
    if (!ark_mem->initsetup) {

      ewtsetOK = ark_mem->efun(ark_mem->yn,
                               ark_mem->ewt,
                               ark_mem->e_data);
      if (ewtsetOK != 0) {
        if (ark_mem->itol == ARK_WF)
          arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                          MSG_ARK_EWT_NOW_FAIL, ark_mem->tcur);
        else
          arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                          MSG_ARK_EWT_NOW_BAD, ark_mem->tcur);

        istate = ARK_ILL_INPUT;
        ark_mem->tretlast = *tret = ark_mem->tcur;
        N_VScale(ONE, ark_mem->yn, yout);
        break;
      }

      if (!ark_mem->rwt_is_ewt) {
        ewtsetOK = ark_mem->rfun(ark_mem->yn,
                                 ark_mem->rwt,
                                 ark_mem->r_data);
        if (ewtsetOK != 0) {
          if (ark_mem->itol == ARK_WF)
            arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                            MSG_ARK_RWT_NOW_FAIL, ark_mem->tcur);
          else
            arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkEvolve",
                            MSG_ARK_RWT_NOW_BAD, ark_mem->tcur);

          istate = ARK_ILL_INPUT;
          ark_mem->tretlast = *tret = ark_mem->tcur;
          N_VScale(ONE, ark_mem->yn, yout);
          break;
        }
      }
    }

    /* Check for too many steps */
    if ( (ark_mem->mxstep > 0) && (nstloc >= ark_mem->mxstep) ) {
      arkProcessError(ark_mem, ARK_TOO_MUCH_WORK, "ARKode", "arkEvolve",
                      MSG_ARK_MAX_STEPS, ark_mem->tcur);
      istate = ARK_TOO_MUCH_WORK;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(ark_mem->yn, ark_mem->ewt);
    ark_mem->tolsf = ark_mem->uround * nrm;
    if (ark_mem->tolsf > ONE) {
      arkProcessError(ark_mem, ARK_TOO_MUCH_ACC, "ARKode", "arkEvolve",
                      MSG_ARK_TOO_MUCH_ACC, ark_mem->tcur);
      istate = ARK_TOO_MUCH_ACC;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->tolsf *= TWO;
      break;
    } else {
      ark_mem->tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (ark_mem->tcur + ark_mem->h == ark_mem->tcur) {
      ark_mem->nhnil++;
      if (ark_mem->nhnil <= ark_mem->mxhnil)
        arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                        MSG_ARK_HNIL, ark_mem->tcur, ark_mem->h);
      if (ark_mem->nhnil == ark_mem->mxhnil)
        arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                        MSG_ARK_HNIL_DONE);
    }

    /* Update parameter for upcoming step size */
    if (ark_mem->hprime != ark_mem->h) {
      ark_mem->h = ark_mem->h * ark_mem->eta;
      ark_mem->next_h = ark_mem->h;
    }
    if (ark_mem->fixedstep) {
      ark_mem->h = ark_mem->hin;
      ark_mem->next_h = ark_mem->h;

      /* patch for 'fixedstep' + 'tstop' use case: 
         limit fixed step size if step would overtake tstop */
      if ( ark_mem->tstopset ) {
        if ( (ark_mem->tcur + ark_mem->h - ark_mem->tstop)*ark_mem->h > ZERO ) {
          ark_mem->h = (ark_mem->tstop - ark_mem->tcur) *
            (ONE-FOUR*ark_mem->uround);
        }
      }
    }

    /* Looping point for step attempts */
    dsm = ZERO;
    attempts = ncf = nef = constrfails = ark_mem->last_kflag = 0;
    nflag = FIRST_CALL;
    for(;;) {

      /* increment attempt counters */
      attempts++;
      ark_mem->nst_attempts++;

#ifdef SUNDIALS_DEBUG
      printf("ARKODE start step %li,  attempt %i,  h = %"RSYM",  t_n = %"RSYM"\n",
             ark_mem->nst, attempts, ark_mem->h, ark_mem->tcur);
#endif

      /* Call time stepper module to attempt a step:
            0 => step completed successfully
           >0 => step encountered recoverable failure; reduce step if possible
           <0 => step encountered unrecoverable failure */
      kflag = ark_mem->step((void*) ark_mem, &dsm, &nflag);
      if (kflag < 0)  break;

      /* handle solver convergence failures */
      kflag = arkCheckConvergence(ark_mem, &nflag, &ncf);
      if (kflag < 0)  break;

      /* perform constraint-handling (if selected, and if solver check passed) */
      if (ark_mem->constraintsSet && (kflag == ARK_SUCCESS)) {
        kflag = arkCheckConstraints(ark_mem, &constrfails, &nflag);
        if (kflag < 0)  break;
      }

      /* when fixed time-stepping is enabled, 'success' == successful stage solves
         (checked in previous block), so just enforce no step size change */
      if (ark_mem->fixedstep) {
        ark_mem->eta = ONE;
        break;
      }

      /* check temporal error (if checks above passed) */
      if (kflag == ARK_SUCCESS) {
        kflag = arkCheckTemporalError(ark_mem, &nflag, &nef, dsm);
        if (kflag < 0)  break;
      }

      /* if we've made it here then no nonrecoverable failures occurred; someone above
         has recommended an 'eta' value for the next step -- enforce bounds on that value
         and set upcoming step size */
      ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
      ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
      ark_mem->eta /= SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv*ark_mem->eta);

      /* if ignoring temporal error test result (XBraid) force step to pass */
      if (ark_mem->force_pass) {
        ark_mem->last_kflag = kflag;
        kflag = ARK_SUCCESS;
        break;
      }

      /* break attempt loop on successful step */
      if (kflag == ARK_SUCCESS)  break;

      /* unsuccessful step, if |h| = hmin, return ARK_ERR_FAILURE */
      if (SUNRabs(ark_mem->h) <= ark_mem->hmin*ONEPSM) return(ARK_ERR_FAILURE);

      /* update h, hprime and next_h for next iteration */
      ark_mem->h *= ark_mem->eta;
      ark_mem->next_h = ark_mem->hprime = ark_mem->h;

    } /* end looping for step attempts */

    /* If step attempt loop succeeded, complete step (update current time, solution,
       error stepsize history arrays; call user-supplied step postprocessing function)
       (added stuff from arkStep_PrepareNextStep -- revisit) */
    if (kflag == ARK_SUCCESS)  kflag = arkCompleteStep(ark_mem, dsm);

    /* If step attempt loop failed, process flag and return to user */
    if (kflag != ARK_SUCCESS) {
      istate = arkHandleFailure(ark_mem, kflag);
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      break;
    }

    nstloc++;

    /* Check for root in last step taken. */
    if (ark_mem->root_mem != NULL) {
      if (ark_mem->root_mem->nrtfn > 0) {

        retval = arkRootCheck3((void*) ark_mem);
        if (retval == RTFOUND) {  /* A new root was found */
          ark_mem->root_mem->irfnd = 1;
          istate = ARK_ROOT_RETURN;
          ark_mem->tretlast = *tret = ark_mem->root_mem->tlo;
          break;
        } else if (retval == ARK_RTFUNC_FAIL) { /* g failed */
          arkProcessError(ark_mem, ARK_RTFUNC_FAIL, "ARKode", "arkEvolve",
                          MSG_ARK_RTFUNC_FAILED, ark_mem->root_mem->tlo);
          istate = ARK_RTFUNC_FAIL;
          break;
        }

        /* If we are at the end of the first step and we still have
           some event functions that are inactive, issue a warning
           as this may indicate a user error in the implementation
           of the root function. */
        if (ark_mem->nst==1) {
          inactive_roots = SUNFALSE;
          for (ir=0; ir<ark_mem->root_mem->nrtfn; ir++) {
            if (!ark_mem->root_mem->gactive[ir]) {
              inactive_roots = SUNTRUE;
              break;
            }
          }
          if ((ark_mem->root_mem->mxgnull > 0) && inactive_roots) {
            arkProcessError(ark_mem, ARK_WARNING, "ARKode", "arkEvolve",
                            MSG_ARK_INACTIVE_ROOTS);
          }
        }
      }
    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == ARK_NORMAL) &&
         (ark_mem->tcur-tout)*ark_mem->h >= ZERO ) {
      istate = ARK_SUCCESS;
      ark_mem->tretlast = *tret = tout;
      (void) arkGetDky(ark_mem, tout, 0, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( ark_mem->tstopset ) {
      troundoff = FUZZ_FACTOR*ark_mem->uround *
        (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
      if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff) {
        (void) arkGetDky(ark_mem, ark_mem->tstop, 0, yout);
        ark_mem->tretlast = *tret = ark_mem->tstop;
        ark_mem->tstopset = SUNFALSE;
        istate = ARK_TSTOP_RETURN;
        break;
      }
      /* limit upcoming step if it will overcome tstop */
      if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->h > ZERO ) {
        ark_mem->hprime = (ark_mem->tstop - ark_mem->tcur) *
          (ONE-FOUR*ark_mem->uround);
        ark_mem->eta = ark_mem->hprime/ark_mem->h;
      }
    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == ARK_ONE_STEP) {
      istate = ARK_SUCCESS;
      ark_mem->tretlast = *tret = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, yout);
      ark_mem->next_h = ark_mem->hprime;
      break;
    }

  } /* end looping for internal steps */

  return(istate);
}